

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult GenValidUsageNextXrCreateEnvironmentDepthSwapchainMETA
                   (XrEnvironmentDepthProviderMETA environmentDepthProvider,
                   XrEnvironmentDepthSwapchainCreateInfoMETA *createInfo,
                   XrEnvironmentDepthSwapchainMETA *swapchain)

{
  XrResult XVar1;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar2;
  unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_> handle_info
  ;
  
  pVar2 = HandleInfo<XrEnvironmentDepthProviderMETA_T_*>::getWithInstanceInfo
                    (&g_environmentdepthprovidermeta_info,environmentDepthProvider);
  XVar1 = (*(pVar2.second)->dispatch_table->CreateEnvironmentDepthSwapchainMETA)
                    (environmentDepthProvider,createInfo,swapchain);
  if ((swapchain != (XrEnvironmentDepthSwapchainMETA *)0x0) && (XVar1 == XR_SUCCESS)) {
    handle_info._M_t.
    super___uniq_ptr_impl<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>
    ._M_t.
    super__Tuple_impl<0UL,_GenValidUsageXrHandleInfo_*,_std::default_delete<GenValidUsageXrHandleInfo>_>
    .super__Head_base<0UL,_GenValidUsageXrHandleInfo_*,_false>._M_head_impl =
         (__uniq_ptr_data<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>,_true,_true>
          )operator_new(0x18);
    *(long *)handle_info._M_t.
             super___uniq_ptr_impl<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_GenValidUsageXrHandleInfo_*,_std::default_delete<GenValidUsageXrHandleInfo>_>
             .super__Head_base<0UL,_GenValidUsageXrHandleInfo_*,_false>._M_head_impl = 0;
    *(long *)((long)handle_info._M_t.
                    super___uniq_ptr_impl<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_GenValidUsageXrHandleInfo_*,_std::default_delete<GenValidUsageXrHandleInfo>_>
                    .super__Head_base<0UL,_GenValidUsageXrHandleInfo_*,_false>._M_head_impl + 8) = 0
    ;
    *(GenValidUsageXrInstanceInfo **)
     handle_info._M_t.
     super___uniq_ptr_impl<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>
     ._M_t.
     super__Tuple_impl<0UL,_GenValidUsageXrHandleInfo_*,_std::default_delete<GenValidUsageXrHandleInfo>_>
     .super__Head_base<0UL,_GenValidUsageXrHandleInfo_*,_false>._M_head_impl = pVar2.second;
    *(undefined4 *)
     ((long)handle_info._M_t.
            super___uniq_ptr_impl<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>
            ._M_t.
            super__Tuple_impl<0UL,_GenValidUsageXrHandleInfo_*,_std::default_delete<GenValidUsageXrHandleInfo>_>
            .super__Head_base<0UL,_GenValidUsageXrHandleInfo_*,_false>._M_head_impl + 8) =
         0x3b9f3ab8;
    *(XrEnvironmentDepthProviderMETA *)
     ((long)handle_info._M_t.
            super___uniq_ptr_impl<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>
            ._M_t.
            super__Tuple_impl<0UL,_GenValidUsageXrHandleInfo_*,_std::default_delete<GenValidUsageXrHandleInfo>_>
            .super__Head_base<0UL,_GenValidUsageXrHandleInfo_*,_false>._M_head_impl + 0x10) =
         environmentDepthProvider;
    HandleInfoBase<XrEnvironmentDepthSwapchainMETA_T_*,_GenValidUsageXrHandleInfo>::insert
              (&g_environmentdepthswapchainmeta_info.
                super_HandleInfoBase<XrEnvironmentDepthSwapchainMETA_T_*,_GenValidUsageXrHandleInfo>
               ,*swapchain,&handle_info);
    std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>::
    ~unique_ptr(&handle_info);
    XVar1 = XR_SUCCESS;
  }
  return XVar1;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL GenValidUsageNextXrCreateEnvironmentDepthSwapchainMETA(
    XrEnvironmentDepthProviderMETA environmentDepthProvider,
    const XrEnvironmentDepthSwapchainCreateInfoMETA* createInfo,
    XrEnvironmentDepthSwapchainMETA* swapchain) {
    XrResult result = XR_SUCCESS;
    try {
        auto info_with_instance = g_environmentdepthprovidermeta_info.getWithInstanceInfo(environmentDepthProvider);
        GenValidUsageXrHandleInfo *gen_environmentdepthprovidermeta_info = info_with_instance.first;
        (void)gen_environmentdepthprovidermeta_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        result = gen_instance_info->dispatch_table->CreateEnvironmentDepthSwapchainMETA(environmentDepthProvider, createInfo, swapchain);
        if (XR_SUCCESS == result && nullptr != swapchain) {
            std::unique_ptr<GenValidUsageXrHandleInfo> handle_info(new GenValidUsageXrHandleInfo());
            handle_info->instance_info = gen_instance_info;
            handle_info->direct_parent_type = XR_OBJECT_TYPE_ENVIRONMENT_DEPTH_PROVIDER_META;
            handle_info->direct_parent_handle = MakeHandleGeneric(environmentDepthProvider);
            g_environmentdepthswapchainmeta_info.insert(*swapchain, std::move(handle_info));
        }
    } catch (std::bad_alloc&) {
        result = XR_ERROR_OUT_OF_MEMORY;
    } catch (...) {
        result = XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}